

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> * __thiscall
despot::BaseRockSample::ComputeOptimalSamplingPolicy(BaseRockSample *this)

{
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *pvVar1;
  pointer pVVar2;
  pointer pVVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  clock_t cVar9;
  long lVar10;
  size_type sVar11;
  int a;
  ulong uVar12;
  size_type __n;
  ulong uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> next_policy;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  transition;
  allocator_type local_91;
  double local_90;
  undefined1 local_88 [16];
  pointer local_78;
  ulong local_70;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  clock_t local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  long lVar17;
  
  uVar6 = (**(code **)(*(long *)this + 0x10))();
  pvVar1 = &this->mdp_policy_;
  __n = (size_type)(int)uVar6;
  if ((long)(this->mdp_policy_).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->mdp_policy_).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 != __n) {
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_88,__n,
               (allocator_type *)&local_68);
    pVVar2 = (this->mdp_policy_).
             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
             .super__Vector_impl_data._M_start;
    pVVar3 = (this->mdp_policy_).
             super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    (this->mdp_policy_).
    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (this->mdp_policy_).
    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    (this->mdp_policy_).
    super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_78;
    local_88 = (undefined1  [16])0x0;
    local_78 = (pointer)0x0;
    if (pVVar2 != (pointer)0x0) {
      operator_delete(pVVar2,(long)pVVar3 - (long)pVVar2);
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
      }
    }
    auVar5 = _DAT_00115080;
    if (0 < (int)uVar6) {
      pVVar2 = (pvVar1->
               super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = __n - 1;
      auVar15._8_4_ = (int)lVar10;
      auVar15._0_8_ = lVar10;
      auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = 0;
      auVar15 = auVar15 ^ _DAT_00115080;
      auVar16 = _DAT_00115070;
      do {
        auVar18 = auVar16 ^ auVar5;
        if ((bool)(~(auVar18._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar18._0_4_ ||
                    auVar15._4_4_ < auVar18._4_4_) & 1)) {
          *(undefined8 *)(pVVar2 + lVar10 + 8) = 0;
        }
        if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
            auVar18._12_4_ <= auVar15._12_4_) {
          *(undefined8 *)(pVVar2 + lVar10 + 0x18) = 0;
        }
        lVar17 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar17 + 2;
        lVar10 = lVar10 + 0x20;
      } while ((ulong)(uVar6 + 1 >> 1) << 5 != lVar10);
    }
    local_50 = clock();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Computing optimal MDP policy...",0x1f);
    std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
              ((vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_> *)local_88,__n,
               (allocator_type *)&local_68);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_68,__n,&local_91);
    local_70 = (ulong)uVar6;
    if (0 < (int)uVar6) {
      sVar11 = 0;
      do {
        std::vector<int,_std::allocator<int>_>::resize
                  (local_68.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar11,5);
        lVar10 = 0;
        do {
          iVar7 = NextState(this,(int)sVar11,(ACT_TYPE)lVar10);
          local_68.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[sVar11].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar10] = iVar7;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 5);
        sVar11 = sVar11 + 1;
      } while (sVar11 != __n);
    }
    local_90 = (double)Globals::NEG_INFTY;
    local_38 = local_70 & 0xffffffff;
    local_48 = local_38 << 4;
    uVar12 = 0;
    do {
      if ((int)local_70 < 1) {
LAB_0010f86f:
        uVar6 = (int)uVar12 + 1;
        dVar14 = 0.0;
        break;
      }
      uVar13 = 0;
      local_40 = uVar12;
      do {
        lVar10 = uVar13 * 0x10;
        *(undefined4 *)(local_88._0_8_ + lVar10) = 0xffffffff;
        *(double *)(local_88._0_8_ + lVar10 + 8) = local_90;
        uVar12 = 0;
        do {
          dVar14 = (double)(**(code **)(*(long *)this + 0x28))
                                     (this,uVar13 & 0xffffffff,uVar12 & 0xffffffff);
          dVar14 = _ParticleBelief *
                   *(double *)
                    ((pvVar1->
                     super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>
                     )._M_impl.super__Vector_impl_data._M_start +
                    (long)local_68.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12] * 0x10 + 8) + dVar14;
          if (*(double *)(local_88._0_8_ + lVar10 + 8) <= dVar14 &&
              dVar14 != *(double *)(local_88._0_8_ + lVar10 + 8)) {
            *(double *)((pointer)(local_88._0_8_ + lVar10) + 8) = dVar14;
            *(int *)(local_88._0_8_ + lVar10) = (int)uVar12;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != 5);
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_38);
      uVar12 = local_40;
      if ((int)local_70 < 1) goto LAB_0010f86f;
      dVar14 = 0.0;
      lVar10 = 0;
      do {
        pVVar2 = (pvVar1->
                 super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        dVar14 = dVar14 + ABS(*(double *)(local_88._0_8_ + lVar10 + 8) -
                              *(double *)(pVVar2 + lVar10 + 8));
        uVar4 = *(undefined8 *)((pointer)(local_88._0_8_ + lVar10) + 8);
        pVVar2 = pVVar2 + lVar10;
        *(undefined8 *)pVVar2 = *(undefined8 *)(local_88._0_8_ + lVar10);
        *(undefined8 *)(pVVar2 + 8) = uVar4;
        lVar10 = lVar10 + 0x10;
      } while (local_48 != lVar10);
      uVar6 = (int)local_40 + 1;
      uVar12 = (ulong)uVar6;
    } while (0.001 <= dVar14);
    local_90 = dVar14;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Done [",6);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," iters, tol = ",0xe);
    poVar8 = std::ostream::_M_insert<double>(local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
    cVar9 = clock();
    poVar8 = std::ostream::_M_insert<double>((double)(cVar9 - local_50) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"s]!",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_68);
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
    }
  }
  return pvVar1;
}

Assistant:

vector<ValuedAction>& BaseRockSample::ComputeOptimalSamplingPolicy() const {
	int num_states = NumStates();
	if (mdp_policy_.size() == num_states)
		return mdp_policy_;

	mdp_policy_ = vector<ValuedAction>(num_states);
	for (int s = 0; s < num_states; s++) {
		mdp_policy_[s].value = 0;
	}

	clock_t start = clock();
	cerr << "Computing optimal MDP policy...";
	vector<ValuedAction> next_policy = vector<ValuedAction>(num_states);
	// Using precomputed transition saves around 60% of the time
	vector<vector<int> > transition = vector<vector<int> >(num_states);
	for (int s = 0; s < num_states; s++) {
		transition[s].resize(E_SAMPLE + 1);
		for (int a = 0; a <= E_SAMPLE; a++) // Sensing actions not needed
			transition[s][a] = NextState(s, a);
	}

	int iter = 0;
	double diff;
	while (true) {
		for (int s = 0; s < num_states; s++) {
			next_policy[s].action = -1;
			next_policy[s].value = Globals::NEG_INFTY;

			for (ACT_TYPE a = 0; a <= E_SAMPLE; a++) {
				double v = Reward(s, a)
					+ Globals::Discount() * mdp_policy_[transition[s][a]].value;

				if (v > next_policy[s].value) {
					next_policy[s].value = v;
					next_policy[s].action = a;
				}
			}
		}

		diff = 0;
		for (int s = 0; s < num_states; s++) {
			diff += fabs(next_policy[s].value - mdp_policy_[s].value);
			mdp_policy_[s] = next_policy[s];
		}

		iter++;
		if (diff < 0.001)
			break;
	}
	cerr << "Done [" << iter << " iters, tol = " << diff << ", "
		<< (double) (clock() - start) / CLOCKS_PER_SEC << "s]!" << endl;

	return mdp_policy_;
}